

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

rdr_t * rdr_new(_Bool autouni)

{
  rdr_t *prVar1;
  qrk_t *pqVar2;
  byte in_DIL;
  rdr_t *rdr;
  size_t in_stack_fffffffffffffff0;
  
  prVar1 = (rdr_t *)xmalloc(in_stack_fffffffffffffff0);
  prVar1->autouni = (_Bool)(in_DIL & 1);
  prVar1->nbi = 0;
  prVar1->nuni = 0;
  prVar1->npats = 0;
  prVar1->ntoks = 0;
  prVar1->pats = (pat_t **)0x0;
  pqVar2 = qrk_new();
  prVar1->lbl = pqVar2;
  pqVar2 = qrk_new();
  prVar1->obs = pqVar2;
  return prVar1;
}

Assistant:

rdr_t *rdr_new(bool autouni) {
	rdr_t *rdr = xmalloc(sizeof(rdr_t));
	rdr->autouni = autouni;
	rdr->npats = rdr->nuni = rdr->nbi = 0;
	rdr->ntoks = 0;
	rdr->pats = NULL;
	rdr->lbl = qrk_new();
	rdr->obs = qrk_new();
	return rdr;
}